

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterhash.h
# Opt level: O0

void __thiscall
CharacterHash<unsigned_long_long,_unsigned_char>::CharacterHash
          (CharacterHash<unsigned_long_long,_unsigned_char> *this,unsigned_long_long maxval)

{
  uint32_conflict uVar1;
  uint32_conflict uVar2;
  unsigned_long_long local_2760;
  ulong local_2750;
  size_t k;
  mersenneRNG randomgeneratorbase;
  mersenneRNG randomgenerator;
  unsigned_long_long maxval_local;
  CharacterHash<unsigned_long_long,_unsigned_char> *this_local;
  
  mersenneRNG::mersenneRNG((mersenneRNG *)&randomgeneratorbase.n,(uint32_conflict)(maxval >> 0x20));
  local_2760 = maxval;
  if (maxval >> 0x20 != 0) {
    local_2760 = 0xffffffff;
  }
  mersenneRNG::mersenneRNG((mersenneRNG *)&k,(uint32_conflict)local_2760);
  for (local_2750 = 0; local_2750 < 0x100; local_2750 = local_2750 + 1) {
    uVar1 = mersenneRNG::operator()((mersenneRNG *)&k);
    uVar2 = mersenneRNG::operator()((mersenneRNG *)&randomgeneratorbase.n);
    this->hashvalues[local_2750] = CONCAT44(uVar2,uVar1);
  }
  return;
}

Assistant:

CharacterHash(hashvaluetype maxval) {
    if (sizeof(hashvaluetype) <= 4) {
      mersenneRNG randomgenerator(maxval);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgenerator());
    } else if (sizeof(hashvaluetype) == 8) {
      mersenneRNG randomgenerator(maxval >> 32);
      mersenneRNG randomgeneratorbase((maxval >> 32) == 0 ? maxval
                                                          : 0xFFFFFFFFU);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgeneratorbase()) |
                        (static_cast<hashvaluetype>(randomgenerator()) << 32);
    } else
      throw runtime_error("unsupported hash value type");
  }